

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Data<4U> * read_standard_pair_data<4u>(char *PATH,int interval,int *cnt)

{
  uint uVar1;
  int __fd;
  undefined8 *__addr;
  Data<4U> *pDVar2;
  ulong uVar3;
  undefined8 *puVar4;
  char *__s;
  stat buf;
  
  __fd = open(PATH,0);
  fstat(__fd,(stat *)&buf);
  *cnt = (int)(buf.st_size / (long)interval);
  __addr = (undefined8 *)mmap((void *)0x0,buf.st_size,1,2,__fd,0);
  close(__fd);
  if (__addr == (undefined8 *)0xffffffffffffffff) {
    __s = "[ERROR] MMAP FAILED!";
  }
  else {
    uVar1 = *cnt;
    pDVar2 = (Data<4U> *)malloc((ulong)(uVar1 * 8));
    if (pDVar2 != (Data<4U> *)0x0) {
      puVar4 = __addr;
      for (uVar3 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar3; uVar3 = uVar3 + 1) {
        *(undefined8 *)(pDVar2 + uVar3 * 2) = *puVar4;
        puVar4 = (undefined8 *)((long)puVar4 + (long)interval);
      }
      munmap(__addr,buf.st_size);
      return pDVar2;
    }
    __s = "[ERROR] MALLOC FAILED!";
  }
  puts(__s);
  exit(-1);
}

Assistant:

Data<DATA_LEN>* read_standard_pair_data(const char* PATH, int interval, int* cnt) {
	struct stat buf;
	// printf("Opening file...\n");
	int fd = open(PATH, O_RDONLY);
	fstat(fd, &buf);

	*cnt = buf.st_size / interval;
	uint8_t* raw_addr = (uint8_t*)mmap(NULL, buf.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
	close(fd);
	if (raw_addr == MAP_FAILED) {
		printf("[ERROR] MMAP FAILED!\n");
		exit(-1);
	}

	int num = *cnt;
	void* raw_data = malloc(DATA_LEN * num * 2);
	if (raw_data == NULL) {
		printf("[ERROR] MALLOC FAILED!\n");
		exit(-1);
	}

	Data<DATA_LEN>* data = reinterpret_cast<Data<DATA_LEN>*>(raw_data);
	for (int i = 0; i < num; i++) {
		data[2 * i] = *reinterpret_cast<Data<DATA_LEN>*>(raw_addr + interval * i);
		data[2 * i + 1] =
			*reinterpret_cast<Data<DATA_LEN>*>(raw_addr + interval * i + DATA_LEN);
	}
	munmap(raw_addr, buf.st_size);
	return data;
}